

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseTraitImpl
          (Parser *this,bool *err,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits)

{
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var1;
  long lVar2;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var3;
  bool bVar4;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_38;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_30;
  
  parseExpression((Parser *)&stack0xffffffffffffffc8,(Precedence)this);
  while( true ) {
    if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
        local_38._M_head_impl == (Expr *)0x0) {
      return;
    }
    bVar4 = isBiOpExpr(local_38._M_head_impl,TOK_OP_COMMA);
    _Var3._M_head_impl = local_38._M_head_impl;
    if (!bVar4) break;
    if ((local_38._M_head_impl)->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_0012b998) {
      __cxa_bad_cast();
    }
    local_30._M_head_impl = *(Expr **)&local_38._M_head_impl[1].type;
    *(undefined8 *)&local_38._M_head_impl[1].type = 0;
    if (local_30._M_head_impl != (Expr *)0x0) {
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval(impltraits,
                       (impltraits->
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (value_type *)&stack0xffffffffffffffd0);
    }
    _Var1._M_head_impl = (Expr *)_Var3._M_head_impl[1].lexer;
    _Var3._M_head_impl[1].lexer = (Lexer *)0x0;
    if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_38._M_head_impl !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      lVar2 = *(long *)local_38._M_head_impl;
      local_38._M_head_impl = _Var1._M_head_impl;
      (**(code **)(lVar2 + 8))();
      _Var1._M_head_impl = local_38._M_head_impl;
    }
    local_38._M_head_impl = _Var1._M_head_impl;
    if (local_30._M_head_impl != (Expr *)0x0) {
      (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                     *)&(local_30._M_head_impl)->_vptr_Expr)->
                  super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                  .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                 _M_head_impl)->pos).line)();
    }
  }
  if ((Lexer *)local_38._M_head_impl == (Lexer *)0x0) {
    return;
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::_M_insert_rval(impltraits,
                   (impltraits->
                   super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,(value_type *)&stack0xffffffffffffffc8
                  );
  if (local_38._M_head_impl == (Expr *)0x0) {
    return;
  }
  (**(code **)(*(long *)local_38._M_head_impl + 8))();
  return;
}

Assistant:

void Parser::parseTraitImpl(bool &err,
    std::vector<std::unique_ptr<Expr>> &impltraits) noexcept {
  // inherit traits
  std::unique_ptr<Expr> expr(parseExpression());
  // comma separated list of expressions
  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto rhs = biopexpr.getRightPtr();
    if (rhs)
      impltraits.insert(impltraits.begin(), std::move(rhs));
    // next iterator step
    expr = biopexpr.getLeftPtr();
  }

  if (expr)
    impltraits.insert(impltraits.begin(), std::move(expr));
}